

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O3

void __thiscall aiMetadata::Add<aiString>(aiMetadata *this,string *key,aiString *value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  aiMetadataEntry *paVar4;
  uint uVar5;
  undefined8 uVar6;
  aiString *paVar7;
  uint *puVar8;
  aiString *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  aiMetadataEntry *local_60;
  
  uVar3 = this->mNumProperties;
  uVar10 = (ulong)uVar3;
  uVar11 = (ulong)(uVar3 + 1);
  paVar7 = (aiString *)operator_new__(uVar11 * 0x404);
  if (uVar3 == 0xffffffff) {
    local_60 = (aiMetadataEntry *)operator_new__(0);
  }
  else {
    paVar9 = paVar7;
    do {
      paVar9->length = 0;
      paVar9->data[0] = '\0';
      memset(paVar9->data + 1,0x1b,0x3ff);
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar7 + uVar11);
    local_60 = (aiMetadataEntry *)operator_new__(uVar11 << 4);
    if (uVar10 == 0) {
      paVar9 = this->mKeys;
      goto LAB_002ed727;
    }
  }
  paVar9 = this->mKeys;
  paVar4 = this->mValues;
  lVar13 = 4;
  lVar12 = 0;
  do {
    if (paVar7 != paVar9) {
      uVar3 = *(uint *)(paVar9->data + lVar13 + -8);
      *(uint *)(paVar7->data + lVar13 + -8) = uVar3;
      memcpy(paVar7->data + lVar13 + -4,paVar9->data + lVar13 + -4,(ulong)uVar3);
      (paVar7->data + lVar13 + -4)[uVar3] = '\0';
    }
    puVar1 = (undefined8 *)((long)&paVar4->mType + lVar12);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)&local_60->mType + lVar12);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    lVar13 = lVar13 + 0x404;
    lVar12 = lVar12 + 0x10;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
LAB_002ed727:
  if (paVar9 != (aiString *)0x0) {
    operator_delete__(paVar9);
  }
  if (this->mValues != (aiMetadataEntry *)0x0) {
    operator_delete__(this->mValues);
  }
  this->mKeys = paVar7;
  this->mValues = local_60;
  uVar3 = this->mNumProperties;
  this->mNumProperties = uVar3 + 1;
  if ((uVar3 + 1 != 0) && (uVar10 = key->_M_string_length, uVar10 != 0)) {
    if (uVar10 < 0x400) {
      paVar7[uVar3].length = (ai_uint32)uVar10;
      memcpy(paVar7[uVar3].data,(key->_M_dataplus)._M_p,uVar10);
      paVar7[uVar3].data[uVar10] = '\0';
    }
    local_60[uVar3].mType = AI_AISTRING;
    puVar8 = (uint *)operator_new(0x404);
    uVar5 = 0x3ff;
    if (value->length < 0x3ff) {
      uVar5 = value->length;
    }
    *puVar8 = uVar5;
    memcpy(puVar8 + 1,value->data,(ulong)uVar5);
    *(undefined1 *)((long)puVar8 + (ulong)uVar5 + 4) = 0;
    local_60[uVar3].mData = puVar8;
  }
  return;
}

Assistant:

inline
    void Add(const std::string& key, const T& value) {
		aiString* new_keys = new aiString[mNumProperties + 1];
		aiMetadataEntry* new_values = new aiMetadataEntry[mNumProperties + 1];

		for(unsigned int i = 0; i < mNumProperties; ++i)
		{
			new_keys[i] = mKeys[i];
			new_values[i] = mValues[i];
		}

		delete[] mKeys;
		delete[] mValues;

		mKeys = new_keys;
		mValues = new_values;

		mNumProperties++;

		Set(mNumProperties - 1, key, value);
	}